

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib582.c
# Opt level: O3

int checkForCompletion(CURLM *curl,int *success)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  int numMessages;
  undefined1 local_34 [4];
  
  *success = 0;
  piVar2 = (int *)curl_multi_info_read(curl,local_34);
  if (piVar2 == (int *)0x0) {
    iVar1 = 0;
  }
  else {
    do {
      if (*piVar2 == 1) {
        uVar3 = (uint)(piVar2[4] == 0);
      }
      else {
        uVar3 = 0;
        curl_mfprintf(_stderr,"Got an unexpected message from curl: %i\n");
      }
      *success = uVar3;
      piVar2 = (int *)curl_multi_info_read(curl,local_34);
    } while (piVar2 != (int *)0x0);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int checkForCompletion(CURLM *curl, int *success)
{
  int numMessages;
  CURLMsg *message;
  int result = 0;
  *success = 0;
  while((message = curl_multi_info_read(curl, &numMessages)) != NULL) {
    if(message->msg == CURLMSG_DONE) {
      result = 1;
      if(message->data.result == CURLE_OK)
        *success = 1;
      else
        *success = 0;
    }
    else {
      fprintf(stderr, "Got an unexpected message from curl: %i\n",
              (int)message->msg);
      result = 1;
      *success = 0;
    }
  }
  return result;
}